

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

size_t __thiscall
CCharmapToUniMB::map2
          (CCharmapToUniMB *this,char **output_ptr,size_t *output_buf_len,char *input_ptr,
          size_t input_len,size_t *partial_len)

{
  long *plVar1;
  byte *in_RCX;
  ulong *in_RDX;
  long *in_RSI;
  long in_RDI;
  ulong in_R8;
  undefined8 *in_R9;
  size_t wlen;
  wchar_t wc;
  cmap_mb_entry *entp;
  uchar c;
  size_t needed_out_len;
  size_t local_58;
  wchar_t local_4c;
  size_t local_38;
  ulong local_28;
  byte *local_20;
  
  *in_R9 = 0;
  local_38 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  do {
    if (local_28 == 0) {
      return local_38;
    }
    plVar1 = (long *)(in_RDI + 0x10 + (ulong)*local_20 * 0x10);
    if (*plVar1 == 0) {
      local_4c = *(wchar_t *)(plVar1 + 1);
      local_20 = local_20 + 1;
      local_28 = local_28 - 1;
    }
    else {
      if (local_28 < 2) {
        *in_R9 = 1;
        return local_38;
      }
      local_4c = *(wchar_t *)(*plVar1 + (ulong)local_20[1] * 4);
      local_20 = local_20 + 2;
      local_28 = local_28 - 2;
    }
    local_58 = utf8_ptr::s_wchar_size(local_4c);
    if (*in_RDX < local_58) {
      *in_RDX = 0;
    }
    else {
      local_58 = utf8_ptr::s_putch((char *)*in_RSI,local_4c);
      *in_RSI = local_58 + *in_RSI;
      *in_RDX = *in_RDX - local_58;
    }
    local_38 = local_58 + local_38;
  } while( true );
}

Assistant:

size_t CCharmapToUniMB::map2(char **output_ptr, size_t *output_buf_len,
                             const char *input_ptr, size_t input_len,
                             size_t *partial_len) const
{
    size_t needed_out_len;

    /* presume we won't have a partial last character */
    *partial_len = 0;

    /* we haven't found anything to store in the output yet */
    needed_out_len = 0;

    /* keep going until we've mapped each character */
    while (input_len != 0)
    {
        unsigned char c;
        const cmap_mb_entry *entp;
        wchar_t wc;
        size_t wlen;

        /* get the lead byte of the next input character */
        c = *input_ptr;

        /* get the primary mapping table entry for the lead byte */
        entp = &map_[c];

        /* check for a one-byte or two-byte mapping */
        if (entp->sub == 0)
        {
            /* it's a one-byte character - get the mapping */
            wc = entp->ch;

            /* skip the single byte of input */
            ++input_ptr;
            --input_len;
        }
        else
        {
            /* 
             *   it's a two-byte character lead byte - make sure we have a
             *   complete input character 
             */
            if (input_len < 2)
            {
                /* we have an incomplete last character - tell the caller */
                *partial_len = 1;

                /* we're done mapping it */
                break;
            }

            /* get the second byte of the sequence */
            c = input_ptr[1];

            /* get the translation from the sub-table */
            wc = entp->sub[c];

            /* skip the two-byte sequence */
            input_ptr += 2;
            input_len -= 2;
        }

        /* we have the translation - note its stored UTF-8 byte size */
        wlen = utf8_ptr::s_wchar_size(wc);

        /* check for room to store the output character */
        if (wlen > *output_buf_len)
        {
            /* 
             *   there's no room to store this character - zero out the
             *   output buffer length so that we know not to try storing
             *   anything else in the buffer 
             */
            *output_buf_len = 0;
        }
        else
        {
            /* there's room - store it */
            wlen = utf8_ptr::s_putch(*output_ptr, wc);

            /* consume output buffer space */
            *output_ptr += wlen;
            *output_buf_len -= wlen;
        }

        /* count the needed length, whether we stored it or not */
        needed_out_len += wlen;
    }

    /* return the required output length */
    return needed_out_len;
}